

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O1

IndexTableSegment * __thiscall
ASDCP::MXF::IndexTableSegment::InitFromTLVSet(IndexTableSegment *this,TLVReader *TLVSet)

{
  ulong uVar1;
  size_t *psVar2;
  uint uVar3;
  iterator __position;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  MDDEntry *pMVar7;
  ulong uVar8;
  ILogSink *this_00;
  TLVReader *in_RDX;
  uint uVar9;
  uint uVar10;
  undefined1 *puVar11;
  InterchangeObject *this_01;
  IndexEntry tmp_item;
  Result_t result;
  TLVReader local_110;
  IndexTableSegment *local_a8;
  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
  *local_a0;
  int local_98;
  
  this_01 = (InterchangeObject *)&stack0xffffffffffffff68;
  InterchangeObject::InitFromTLVSet(this_01,TLVSet);
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_IndexEditRate);
    TLVReader::ReadObject(&local_110,(MDDEntry *)in_RDX,(IArchive *)pMVar7);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_IndexStartPosition);
    TLVReader::ReadUi64(&local_110,(MDDEntry *)in_RDX,(ui64_t *)pMVar7);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_IndexDuration);
    TLVReader::ReadUi64(&local_110,(MDDEntry *)in_RDX,(ui64_t *)pMVar7);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_EditUnitByteCount);
    TLVReader::ReadUi32(&local_110,(MDDEntry *)in_RDX,(ui32_t *)pMVar7);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_Core_IndexSID);
    TLVReader::ReadUi32(&local_110,(MDDEntry *)in_RDX,(ui32_t *)pMVar7);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_Core_BodySID);
    TLVReader::ReadUi32(&local_110,(MDDEntry *)in_RDX,(ui32_t *)pMVar7);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_SliceCount);
    TLVReader::ReadUi8(&local_110,(MDDEntry *)in_RDX,pMVar7->ul);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegmentBase_PosTableCount);
    TLVReader::ReadUi8(&local_110,(MDDEntry *)in_RDX,pMVar7->ul);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegment_DeltaEntryArray);
    TLVReader::ReadObject(&local_110,(MDDEntry *)in_RDX,(IArchive *)pMVar7);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)&local_110);
    Kumu::Result_t::~Result_t((Result_t *)&local_110);
  }
  if (-1 < local_98) {
    pMVar7 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_IndexTableSegment_IndexEntryArray);
    bVar5 = TLVReader::FindTL(in_RDX,pMVar7);
    if (bVar5) {
      uVar8 = (ulong)(in_RDX->super_MemIOReader).m_capacity;
      uVar9 = (in_RDX->super_MemIOReader).m_size;
      uVar1 = (ulong)uVar9 + 4;
      if (uVar1 <= uVar8) {
        uVar10 = *(uint *)((in_RDX->super_MemIOReader).m_p + uVar9);
        this_01 = (InterchangeObject *)
                  (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18);
        (in_RDX->super_MemIOReader).m_size = uVar9 + 4;
      }
      bVar4 = true;
      if (uVar1 <= uVar8) {
        uVar9 = (in_RDX->super_MemIOReader).m_size;
        if ((ulong)uVar9 + 4 <= uVar8) {
          uVar10 = *(uint *)((in_RDX->super_MemIOReader).m_p + uVar9);
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          (in_RDX->super_MemIOReader).m_size = uVar9 + 4;
          if (bVar5 && (uint)this_01 != 0) {
            local_a0 = (vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
                        *)&TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_right;
            uVar9 = 1;
            local_a8 = this;
            do {
              local_110.super_MemIOReader.m_p = (byte_t *)&PTR__IArchive_00224af0;
              local_110.super_MemIOReader.m_capacity._0_2_ = 0;
              local_110.super_MemIOReader.m_capacity._2_1_ = 0x80;
              local_110.m_ElementMap._M_t._M_impl._0_8_ = 0;
              bVar5 = IndexEntry::Unarchive((IndexEntry *)&local_110,&in_RDX->super_MemIOReader);
              if (bVar5) {
                __position._M_current =
                     (IndexEntry *)
                     TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
                if (__position._M_current == (IndexEntry *)TLVSet[3].m_Lookup) {
                  std::
                  vector<ASDCP::MXF::IndexTableSegment::IndexEntry,std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>>
                  ::_M_realloc_insert<ASDCP::MXF::IndexTableSegment::IndexEntry_const&>
                            (local_a0,__position,(IndexEntry *)&local_110);
                }
                else {
                  ((__position._M_current)->super_IArchive)._vptr_IArchive =
                       (_func_int **)&PTR__IArchive_00224af0;
                  (__position._M_current)->TemporalOffset =
                       (char)(undefined2)local_110.super_MemIOReader.m_capacity;
                  (__position._M_current)->KeyFrameOffset =
                       (char)((ushort)(undefined2)local_110.super_MemIOReader.m_capacity >> 8);
                  (__position._M_current)->Flags = local_110.super_MemIOReader.m_capacity._2_1_;
                  *(undefined5 *)&(__position._M_current)->field_0xb =
                       local_110.super_MemIOReader._11_5_;
                  (__position._M_current)->StreamOffset = local_110.m_ElementMap._M_t._M_impl._0_8_;
                  psVar2 = &TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  *psVar2 = *psVar2 + 0x18;
                }
                if (0xb < uVar10) {
                  uVar6 = (in_RDX->super_MemIOReader).m_size + (uVar10 - 0xb);
                  uVar3 = (in_RDX->super_MemIOReader).m_capacity;
                  bVar5 = uVar6 <= uVar3;
                  if (uVar6 <= uVar3) {
                    (in_RDX->super_MemIOReader).m_size = uVar6;
                  }
                }
              }
              this = local_a8;
            } while ((uVar9 < (uint)this_01) && (uVar9 = uVar9 + 1, bVar5 != false));
          }
          bVar4 = true;
          if (((long)(TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count -
                     (long)TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_right) >> 3) * -0x5555555555555555 - ((ulong)this_01 & 0xffffffff) !=
              0) {
            this_00 = (ILogSink *)Kumu::DefaultLogSink();
            Kumu::ILogSink::Error
                      (this_00,"Malformed index table segment, could not decode all IndexEntries.\n"
                      );
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_KLV_CODING);
            bVar4 = false;
          }
        }
      }
      if (!bVar4) goto LAB_001b1c48;
    }
    puVar11 = Kumu::RESULT_FALSE;
    if (bVar5 != false) {
      puVar11 = Kumu::RESULT_OK;
    }
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff68,(Result_t *)puVar11);
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
LAB_001b1c48:
  Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::IndexTableSegment::InitFromTLVSet(TLVReader& TLVSet)
{
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(IndexTableSegmentBase, IndexEditRate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(IndexTableSegmentBase, IndexStartPosition));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi64(OBJ_READ_ARGS(IndexTableSegmentBase, IndexDuration));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(IndexTableSegmentBase, EditUnitByteCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(IndexTableSegmentBase, IndexSID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(EssenceContainerData, BodySID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(IndexTableSegmentBase, SliceCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(IndexTableSegmentBase, PosTableCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(IndexTableSegment, DeltaEntryArray));

  if ( ASDCP_SUCCESS(result) )
    {
      bool rc = TLVSet.FindTL(m_Dict->Type(MDD_IndexTableSegment_IndexEntryArray));

      if ( rc )
	{
	  ui32_t item_count, item_size;
	  ui32_t const decoder_item_size = IndexEntryArray.ItemSize();

	  if ( TLVSet.ReadUi32BE(&item_count) )
	    {
	      if ( TLVSet.ReadUi32BE(&item_size) )
		{
		  for ( ui32_t i = 0; i < item_count && rc; ++i )
		    {
		      IndexEntry tmp_item;
		      rc = tmp_item.Unarchive(&TLVSet);

		      if ( rc )
			{
			  IndexEntryArray.push_back(tmp_item);

			  if ( decoder_item_size < item_size )
			    {
			      rc = TLVSet.SkipOffset(item_size - decoder_item_size);
			    }
			}
		    }
          if (IndexEntryArray.size() != item_count)
          {
              DefaultLogSink().Error("Malformed index table segment, could not decode all IndexEntries.\n");
              return RESULT_KLV_CODING;
          }
		}
	    }
	}

      result = rc ? RESULT_OK : RESULT_FALSE;
    }

  return result;
}